

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

int __thiscall lzham::symbol_codec::decode_remove_byte_from_bit_buf(symbol_codec *this)

{
  int result;
  symbol_codec *this_local;
  uint local_4;
  
  if (this->m_bit_count < 8) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = (uint)(byte)(this->m_bit_buf >> 0x38);
    this->m_bit_buf = this->m_bit_buf << 8;
    this->m_bit_count = this->m_bit_count + -8;
  }
  return local_4;
}

Assistant:

int symbol_codec::decode_remove_byte_from_bit_buf()
   {
      if (m_bit_count < 8)
         return -1;
      int result = static_cast<int>(m_bit_buf >> (cBitBufSize - 8));
      m_bit_buf <<= 8;
      m_bit_count -= 8;
      return result;
   }